

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::texture_gather_offset_sampler_2d
               (NegativeTestContext *ctx)

{
  ShaderType SVar1;
  NegativeTestContext *pNVar2;
  bool bVar3;
  char *__s;
  DataType in_stack_fffffffffffff8e0;
  DataType DVar4;
  DataType fourthArgument;
  undefined1 *in_stack_fffffffffffff8e8;
  string local_4d0;
  undefined1 local_4b0 [8];
  string shaderSource_16;
  undefined1 local_470 [8];
  string shaderSource_15;
  undefined1 local_430 [8];
  string shaderSource_14;
  undefined1 local_3f0 [8];
  string shaderSource_13;
  undefined1 local_3b0 [8];
  string shaderSource_12;
  undefined1 local_370 [8];
  string shaderSource_11;
  undefined1 local_330 [8];
  string shaderSource_10;
  undefined1 local_2f0 [8];
  string shaderSource_9;
  undefined1 local_2b0 [8];
  string shaderSource_8;
  undefined1 local_270 [8];
  string shaderSource_7;
  undefined1 local_230 [8];
  string shaderSource_6;
  undefined1 local_1f0 [8];
  string shaderSource_5;
  undefined1 local_1b0 [8];
  string shaderSource_4;
  undefined1 local_170 [8];
  string shaderSource_3;
  undefined1 local_130 [8];
  string shaderSource_2;
  undefined1 local_f0 [8];
  string shaderSource_1;
  undefined1 local_b0 [8];
  string shaderSource;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  int local_48;
  int shaderNdx;
  allocator<char> local_31;
  string local_30;
  NegativeTestContext *local_10;
  NegativeTestContext *ctx_local;
  
  local_10 = ctx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"textureGatherOffset - sampler2D",&local_31);
  NegativeTestContext::beginSection(ctx,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  for (local_48 = 0; local_48 < 6; local_48 = local_48 + 1) {
    bVar3 = NegativeTestContext::isShaderSupported
                      (local_10,*(ShaderType *)
                                 ((anonymous_namespace)::s_shaders + (long)local_48 * 4));
    pNVar2 = local_10;
    fourthArgument = (DataType)in_stack_fffffffffffff8e8;
    if (bVar3) {
      __s = glu::getShaderTypeName
                      (*(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,__s,
                 (allocator<char> *)(shaderSource.field_2._M_local_buf + 0xf));
      std::operator+(&local_68,"Verify shader: ",&local_88);
      NegativeTestContext::beginSection(pNVar2,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_88);
      std::allocator<char>::~allocator((allocator<char> *)(shaderSource.field_2._M_local_buf + 0xf))
      ;
      (anonymous_namespace)::genShaderSourceTextureGatherOffset_abi_cxx11_
                ((string *)local_b0,(_anonymous_namespace_ *)local_10,
                 (NegativeTestContext *)
                 (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),
                 SHADERTYPE_VERTEX,0x28,TYPE_FLOAT,TYPE_INT_VEC2,in_stack_fffffffffffff8e0);
      pNVar2 = local_10;
      SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
      std::__cxx11::string::string
                ((string *)(shaderSource_1.field_2._M_local_buf + 8),(string *)local_b0);
      verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_1.field_2 + 8));
      std::__cxx11::string::~string((string *)(shaderSource_1.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_b0);
      (anonymous_namespace)::genShaderSourceTextureGatherOffset_abi_cxx11_
                ((string *)local_f0,(_anonymous_namespace_ *)local_10,
                 (NegativeTestContext *)
                 (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),
                 SHADERTYPE_VERTEX,0x28,TYPE_FLOAT_VEC2,TYPE_INT,in_stack_fffffffffffff8e0);
      pNVar2 = local_10;
      SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
      std::__cxx11::string::string
                ((string *)(shaderSource_2.field_2._M_local_buf + 8),(string *)local_f0);
      verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_2.field_2 + 8));
      std::__cxx11::string::~string((string *)(shaderSource_2.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_f0);
      (anonymous_namespace)::genShaderSourceTextureGatherOffset_abi_cxx11_
                ((string *)local_130,(_anonymous_namespace_ *)local_10,
                 (NegativeTestContext *)
                 (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),
                 SHADERTYPE_VERTEX,0x28,TYPE_FLOAT,TYPE_INT_VEC2,TYPE_INT,fourthArgument);
      pNVar2 = local_10;
      SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
      std::__cxx11::string::string
                ((string *)(shaderSource_3.field_2._M_local_buf + 8),(string *)local_130);
      verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_3.field_2 + 8));
      std::__cxx11::string::~string((string *)(shaderSource_3.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_130);
      (anonymous_namespace)::genShaderSourceTextureGatherOffset_abi_cxx11_
                ((string *)local_170,(_anonymous_namespace_ *)local_10,
                 (NegativeTestContext *)
                 (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),
                 SHADERTYPE_VERTEX,0x28,TYPE_FLOAT_VEC2,TYPE_INT,TYPE_INT,fourthArgument);
      pNVar2 = local_10;
      SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
      std::__cxx11::string::string
                ((string *)(shaderSource_4.field_2._M_local_buf + 8),(string *)local_170);
      verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_4.field_2 + 8));
      std::__cxx11::string::~string((string *)(shaderSource_4.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_170);
      DVar4 = TYPE_FLOAT;
      (anonymous_namespace)::genShaderSourceTextureGatherOffset_abi_cxx11_
                ((string *)local_1b0,(_anonymous_namespace_ *)local_10,
                 (NegativeTestContext *)
                 (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),
                 SHADERTYPE_VERTEX,0x28,TYPE_FLOAT_VEC2,TYPE_INT_VEC2,TYPE_FLOAT,fourthArgument);
      pNVar2 = local_10;
      SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
      std::__cxx11::string::string
                ((string *)(shaderSource_5.field_2._M_local_buf + 8),(string *)local_1b0);
      verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_5.field_2 + 8));
      std::__cxx11::string::~string((string *)(shaderSource_5.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_1b0);
      (anonymous_namespace)::genShaderSourceTextureGatherOffset_abi_cxx11_
                ((string *)local_1f0,(_anonymous_namespace_ *)local_10,
                 (NegativeTestContext *)
                 (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),
                 SHADERTYPE_VERTEX,0x35,TYPE_FLOAT,TYPE_INT_VEC2,DVar4);
      pNVar2 = local_10;
      SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
      std::__cxx11::string::string
                ((string *)(shaderSource_6.field_2._M_local_buf + 8),(string *)local_1f0);
      verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_6.field_2 + 8));
      std::__cxx11::string::~string((string *)(shaderSource_6.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_1f0);
      (anonymous_namespace)::genShaderSourceTextureGatherOffset_abi_cxx11_
                ((string *)local_230,(_anonymous_namespace_ *)local_10,
                 (NegativeTestContext *)
                 (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),
                 SHADERTYPE_VERTEX,0x35,TYPE_FLOAT_VEC2,TYPE_INT,DVar4);
      pNVar2 = local_10;
      SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
      std::__cxx11::string::string
                ((string *)(shaderSource_7.field_2._M_local_buf + 8),(string *)local_230);
      verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_7.field_2 + 8));
      std::__cxx11::string::~string((string *)(shaderSource_7.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_230);
      (anonymous_namespace)::genShaderSourceTextureGatherOffset_abi_cxx11_
                ((string *)local_270,(_anonymous_namespace_ *)local_10,
                 (NegativeTestContext *)
                 (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),
                 SHADERTYPE_VERTEX,0x35,TYPE_FLOAT,TYPE_INT_VEC2,TYPE_INT,fourthArgument);
      pNVar2 = local_10;
      SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
      std::__cxx11::string::string
                ((string *)(shaderSource_8.field_2._M_local_buf + 8),(string *)local_270);
      verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_8.field_2 + 8));
      std::__cxx11::string::~string((string *)(shaderSource_8.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_270);
      (anonymous_namespace)::genShaderSourceTextureGatherOffset_abi_cxx11_
                ((string *)local_2b0,(_anonymous_namespace_ *)local_10,
                 (NegativeTestContext *)
                 (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),
                 SHADERTYPE_VERTEX,0x35,TYPE_FLOAT_VEC2,TYPE_INT,TYPE_INT,fourthArgument);
      pNVar2 = local_10;
      SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
      std::__cxx11::string::string
                ((string *)(shaderSource_9.field_2._M_local_buf + 8),(string *)local_2b0);
      verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_9.field_2 + 8));
      std::__cxx11::string::~string((string *)(shaderSource_9.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_2b0);
      DVar4 = TYPE_FLOAT;
      (anonymous_namespace)::genShaderSourceTextureGatherOffset_abi_cxx11_
                ((string *)local_2f0,(_anonymous_namespace_ *)local_10,
                 (NegativeTestContext *)
                 (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),
                 SHADERTYPE_VERTEX,0x35,TYPE_FLOAT_VEC2,TYPE_INT_VEC2,TYPE_FLOAT,fourthArgument);
      pNVar2 = local_10;
      SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
      std::__cxx11::string::string
                ((string *)(shaderSource_10.field_2._M_local_buf + 8),(string *)local_2f0);
      verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_10.field_2 + 8));
      std::__cxx11::string::~string((string *)(shaderSource_10.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_2f0);
      (anonymous_namespace)::genShaderSourceTextureGatherOffset_abi_cxx11_
                ((string *)local_330,(_anonymous_namespace_ *)local_10,
                 (NegativeTestContext *)
                 (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),
                 SHADERTYPE_VERTEX,0x3c,TYPE_FLOAT,TYPE_INT_VEC2,DVar4);
      pNVar2 = local_10;
      SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
      std::__cxx11::string::string
                ((string *)(shaderSource_11.field_2._M_local_buf + 8),(string *)local_330);
      verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_11.field_2 + 8));
      std::__cxx11::string::~string((string *)(shaderSource_11.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_330);
      (anonymous_namespace)::genShaderSourceTextureGatherOffset_abi_cxx11_
                ((string *)local_370,(_anonymous_namespace_ *)local_10,
                 (NegativeTestContext *)
                 (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),
                 SHADERTYPE_VERTEX,0x3c,TYPE_FLOAT_VEC2,TYPE_INT,DVar4);
      pNVar2 = local_10;
      SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
      std::__cxx11::string::string
                ((string *)(shaderSource_12.field_2._M_local_buf + 8),(string *)local_370);
      verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_12.field_2 + 8));
      std::__cxx11::string::~string((string *)(shaderSource_12.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_370);
      (anonymous_namespace)::genShaderSourceTextureGatherOffset_abi_cxx11_
                ((string *)local_3b0,(_anonymous_namespace_ *)local_10,
                 (NegativeTestContext *)
                 (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),
                 SHADERTYPE_VERTEX,0x3c,TYPE_FLOAT,TYPE_INT_VEC2,TYPE_INT,fourthArgument);
      pNVar2 = local_10;
      SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
      std::__cxx11::string::string
                ((string *)(shaderSource_13.field_2._M_local_buf + 8),(string *)local_3b0);
      verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_13.field_2 + 8));
      std::__cxx11::string::~string((string *)(shaderSource_13.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_3b0);
      (anonymous_namespace)::genShaderSourceTextureGatherOffset_abi_cxx11_
                ((string *)local_3f0,(_anonymous_namespace_ *)local_10,
                 (NegativeTestContext *)
                 (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),
                 SHADERTYPE_VERTEX,0x3c,TYPE_FLOAT_VEC2,TYPE_INT,TYPE_INT,fourthArgument);
      pNVar2 = local_10;
      SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
      std::__cxx11::string::string
                ((string *)(shaderSource_14.field_2._M_local_buf + 8),(string *)local_3f0);
      verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_14.field_2 + 8));
      std::__cxx11::string::~string((string *)(shaderSource_14.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_3f0);
      DVar4 = TYPE_FLOAT;
      (anonymous_namespace)::genShaderSourceTextureGatherOffset_abi_cxx11_
                ((string *)local_430,(_anonymous_namespace_ *)local_10,
                 (NegativeTestContext *)
                 (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),
                 SHADERTYPE_VERTEX,0x3c,TYPE_FLOAT_VEC2,TYPE_INT_VEC2,TYPE_FLOAT,fourthArgument);
      pNVar2 = local_10;
      SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
      std::__cxx11::string::string
                ((string *)(shaderSource_15.field_2._M_local_buf + 8),(string *)local_430);
      verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_15.field_2 + 8));
      std::__cxx11::string::~string((string *)(shaderSource_15.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_430);
      (anonymous_namespace)::genShaderSourceTextureGatherOffset_abi_cxx11_
                ((string *)local_470,(_anonymous_namespace_ *)local_10,
                 (NegativeTestContext *)
                 (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),
                 SHADERTYPE_VERTEX,0x2c,TYPE_FLOAT_VEC2,TYPE_INT_VEC2,DVar4);
      pNVar2 = local_10;
      SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
      std::__cxx11::string::string
                ((string *)(shaderSource_16.field_2._M_local_buf + 8),(string *)local_470);
      verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_16.field_2 + 8));
      std::__cxx11::string::~string((string *)(shaderSource_16.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_470);
      in_stack_fffffffffffff8e8 = (anonymous_namespace)::s_shaders;
      in_stack_fffffffffffff8e0 = TYPE_INT;
      (anonymous_namespace)::genShaderSourceTextureGatherOffset_abi_cxx11_
                ((string *)local_4b0,(_anonymous_namespace_ *)local_10,
                 (NegativeTestContext *)
                 (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),
                 SHADERTYPE_VERTEX,0x2c,TYPE_FLOAT_VEC2,TYPE_INT_VEC2,TYPE_INT,0xf65050);
      pNVar2 = local_10;
      SVar1 = *(ShaderType *)(in_stack_fffffffffffff8e8 + (long)local_48 * 4);
      std::__cxx11::string::string((string *)&local_4d0,(string *)local_4b0);
      verifyShader(pNVar2,SVar1,&local_4d0);
      std::__cxx11::string::~string((string *)&local_4d0);
      std::__cxx11::string::~string((string *)local_4b0);
      NegativeTestContext::endSection(local_10);
    }
  }
  NegativeTestContext::endSection(local_10);
  return;
}

Assistant:

void texture_gather_offset_sampler_2d (NegativeTestContext& ctx)
{
	ctx.beginSection("textureGatherOffset - sampler2D");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffset(ctx, s_shaders[shaderNdx], FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP, glu::TYPE_SAMPLER_2D, glu::TYPE_FLOAT, glu::TYPE_INT_VEC2));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffset(ctx, s_shaders[shaderNdx], FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP, glu::TYPE_SAMPLER_2D, glu::TYPE_FLOAT_VEC2, glu::TYPE_INT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffset(ctx, s_shaders[shaderNdx], FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP, glu::TYPE_SAMPLER_2D, glu::TYPE_FLOAT, glu::TYPE_INT_VEC2, glu::TYPE_INT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffset(ctx, s_shaders[shaderNdx], FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP, glu::TYPE_SAMPLER_2D, glu::TYPE_FLOAT_VEC2, glu::TYPE_INT, glu::TYPE_INT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffset(ctx, s_shaders[shaderNdx], FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP, glu::TYPE_SAMPLER_2D, glu::TYPE_FLOAT_VEC2, glu::TYPE_INT_VEC2, glu::TYPE_FLOAT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffset(ctx, s_shaders[shaderNdx], FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP, glu::TYPE_INT_SAMPLER_2D, glu::TYPE_FLOAT, glu::TYPE_INT_VEC2));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffset(ctx, s_shaders[shaderNdx], FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP, glu::TYPE_INT_SAMPLER_2D, glu::TYPE_FLOAT_VEC2, glu::TYPE_INT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffset(ctx, s_shaders[shaderNdx], FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP, glu::TYPE_INT_SAMPLER_2D, glu::TYPE_FLOAT, glu::TYPE_INT_VEC2, glu::TYPE_INT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffset(ctx, s_shaders[shaderNdx], FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP, glu::TYPE_INT_SAMPLER_2D, glu::TYPE_FLOAT_VEC2, glu::TYPE_INT, glu::TYPE_INT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffset(ctx, s_shaders[shaderNdx], FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP, glu::TYPE_INT_SAMPLER_2D, glu::TYPE_FLOAT_VEC2, glu::TYPE_INT_VEC2, glu::TYPE_FLOAT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffset(ctx, s_shaders[shaderNdx], FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP, glu::TYPE_UINT_SAMPLER_2D, glu::TYPE_FLOAT, glu::TYPE_INT_VEC2));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffset(ctx, s_shaders[shaderNdx], FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP, glu::TYPE_UINT_SAMPLER_2D, glu::TYPE_FLOAT_VEC2, glu::TYPE_INT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffset(ctx, s_shaders[shaderNdx], FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP, glu::TYPE_UINT_SAMPLER_2D, glu::TYPE_FLOAT, glu::TYPE_INT_VEC2, glu::TYPE_INT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffset(ctx, s_shaders[shaderNdx], FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP, glu::TYPE_UINT_SAMPLER_2D, glu::TYPE_FLOAT_VEC2, glu::TYPE_INT, glu::TYPE_INT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffset(ctx, s_shaders[shaderNdx], FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP, glu::TYPE_UINT_SAMPLER_2D, glu::TYPE_FLOAT_VEC2, glu::TYPE_INT_VEC2, glu::TYPE_FLOAT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffset(ctx, s_shaders[shaderNdx], FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP, glu::TYPE_SAMPLER_3D, glu::TYPE_FLOAT_VEC2, glu::TYPE_INT_VEC2));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffset(ctx, s_shaders[shaderNdx], FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP, glu::TYPE_SAMPLER_3D, glu::TYPE_FLOAT_VEC2, glu::TYPE_INT_VEC2, glu::TYPE_INT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}